

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

void strcpy_url(char *output,char *url)

{
  char cVar1;
  bool bVar2;
  
  bVar2 = true;
  do {
    cVar1 = *url;
    if (cVar1 == ' ') {
      if (bVar2) {
        output[0] = '%';
        output[1] = '2';
        output[2] = '0';
        goto LAB_005093bf;
      }
      *output = '+';
LAB_005093c8:
      output = output + 1;
    }
    else {
      if (cVar1 == '?') {
        bVar2 = false;
      }
      else if (cVar1 == '\0') {
        *output = '\0';
        return;
      }
      if (-1 < cVar1) {
        *output = cVar1;
        goto LAB_005093c8;
      }
      curl_msnprintf(output,4,"%%%02x");
LAB_005093bf:
      output = output + 3;
    }
    url = url + 1;
  } while( true );
}

Assistant:

static void strcpy_url(char *output, const char *url)
{
  /* we must add this with whitespace-replacing */
  bool left=TRUE;
  const unsigned char *iptr;
  char *optr = output;
  for(iptr = (unsigned char *)url;    /* read from here */
      *iptr;         /* until zero byte */
      iptr++) {
    switch(*iptr) {
    case '?':
      left=FALSE;
      /* fall through */
    default:
      if(*iptr >= 0x80) {
        snprintf(optr, 4, "%%%02x", *iptr);
        optr += 3;
      }
      else
        *optr++=*iptr;
      break;
    case ' ':
      if(left) {
        *optr++='%'; /* add a '%' */
        *optr++='2'; /* add a '2' */
        *optr++='0'; /* add a '0' */
      }
      else
        *optr++='+'; /* add a '+' here */
      break;
    }
  }
  *optr=0; /* zero terminate output buffer */

}